

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Image image;
  Image IStack_128;
  Image local_c8;
  Image local_68;
  
  std::__cxx11::string::string((string *)&IStack_128,"../img/fist.jpg",(allocator *)&local_c8);
  Image::Image(&local_68,(string *)&IStack_128);
  std::__cxx11::string::~string((string *)&IStack_128);
  Image::sobel(&local_c8,&local_68);
  Image::GNG(&IStack_128,&local_c8);
  Image::displayImage(&IStack_128);
  cv::Mat::~Mat(&IStack_128.content);
  cv::Mat::~Mat(&local_c8.content);
  cv::Mat::~Mat(&local_68.content);
  return 0;
}

Assistant:

int main() {
    Image image("../img/fist.jpg");

    // Image edges(image.canny().getBinaryMatrix());

    // Image gng = image.canny().GNG();
    // image.sobel().displayImage();
    image.sobel().GNG().displayImage();
    return 0;
}